

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

bool __thiscall QKeySequenceEdit::event(QKeySequenceEdit *this,QEvent *e)

{
  short sVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QKeyCombination local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = *(short *)(e + 8);
  bVar4 = true;
  if (sVar1 == 6) {
    lVar2 = *(long *)(this + 8);
    local_2c = QKeyEvent::keyCombination((QKeyEvent *)e);
    bVar3 = QListSpecialMethodsBase<QKeyCombination>::contains<QKeyCombination>
                      ((QListSpecialMethodsBase<QKeyCombination> *)(lVar2 + 0x288),&local_2c);
    if (!bVar3) {
      (**(code **)(*(long *)this + 0xc0))(this,e);
      goto LAB_003e0ece;
    }
  }
  else {
    if (sVar1 == 0x75) goto LAB_003e0ece;
    if (sVar1 == 0x33) {
      e[0xc] = (QEvent)0x1;
      goto LAB_003e0ece;
    }
  }
  bVar4 = QWidget::event((QWidget *)this,e);
LAB_003e0ece:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QKeySequenceEdit::event(QEvent *e)
{
    Q_D(const QKeySequenceEdit);

    switch (e->type()) {
    case QEvent::Shortcut:
        return true;
    case QEvent::ShortcutOverride:
        e->accept();
        return true;
    case QEvent::KeyPress: {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if (!d->finishingKeyCombinations.contains(ke->keyCombination())) {
                keyPressEvent(ke);
                return true;
            }
        }
        break;
    default:
        break;
    }

    return QWidget::event(e);
}